

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_set_cookie(http_s *h,http_cookie_args_s cookie)

{
  long lVar1;
  http_cookie_args_s hVar2;
  http_s *phVar3;
  char cVar4;
  byte bVar5;
  FIOBJ str;
  FIOBJ FVar6;
  FIOBJ *pFVar7;
  size_t sVar8;
  fiobj_object_vtable_s *pfVar9;
  ulong i;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  byte *pbVar13;
  char cVar14;
  ulong capa;
  uint uVar16;
  fio_str_info_s local_98;
  fio_str_info_s local_78;
  undefined8 local_60;
  undefined8 local_58;
  ulong local_50;
  char *local_48;
  ulong local_40;
  http_s *local_38;
  uint uVar15;
  
  hVar2 = cookie;
  if (h == (http_s *)0x0) {
    return -1;
  }
  if ((h->method == 0) && (h->status_str == 0)) {
    if (0x7fff < cookie.name_len || h->status != 0) {
      return -1;
    }
  }
  else if (0x7fff < cookie.name_len) {
    return -1;
  }
  if (0x1ffff < cookie.value_len) {
    return -1;
  }
  capa = cookie.name_len + cookie.value_len + 0x80;
  str = fiobj_str_buf(capa);
  local_40 = cookie.value_len;
  cVar14 = (char)str;
  uVar15 = (uint)str;
  i = (long)str >> 1;
  if (str == 0) {
LAB_00146ce3:
    local_78.data = anon_var_dwarf_20c;
    uVar16 = 4;
    goto LAB_00146cf6;
  }
  if ((str & 1) == 0) {
    switch(uVar15 & 6) {
    case 0:
      cVar4 = *(char *)(str & 0xfffffffffffffff8);
LAB_00146c45:
      switch(cVar4) {
      case '\'':
        pfVar9 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_00146c3a_caseD_2;
      case ')':
        pfVar9 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_00146c3a_caseD_4;
      case '+':
        pfVar9 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar9 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_00146c3a_caseD_2:
      pfVar9 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_00146c3a_caseD_4:
      pfVar9 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar14 == '&') {
        local_78.data = anon_var_dwarf_217;
        uVar16 = 5;
      }
      else {
        if ((uVar15 & 0xff) != 0x16) {
          cVar4 = cVar14;
          if ((uVar15 & 0xff) == 6) goto LAB_00146ce3;
          goto LAB_00146c45;
        }
        local_78.data = anon_var_dwarf_222;
        uVar16 = 4;
      }
LAB_00146cf6:
      local_78.capa = 0;
      local_78.len = (size_t)uVar16;
      goto LAB_00146cfb;
    }
    (*pfVar9->to_str)(&local_78,str);
  }
  else {
    fio_ltocstr(&local_78,i);
  }
LAB_00146cfb:
  local_38 = h;
  if (cookie.name == (char *)0x0) {
LAB_001470fc:
    lVar10 = 0;
  }
  else if (cookie.name_len == 0) {
    bVar5 = *cookie.name;
    if (bVar5 == 0) goto LAB_001470fc;
    local_58 = (ulong)(uVar15 & 6);
    local_48 = (char *)(str & 0xfffffffffffffff8);
    local_60 = (char *)(CONCAT44(local_60._4_4_,uVar15) & 0xffffffff000000ff);
    lVar10 = 0;
    pbVar13 = (byte *)cookie.name;
    local_50 = i;
    do {
      if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [bVar5] == '\0') {
        local_78.data[lVar10] = bVar5;
        lVar10 = lVar10 + 1;
      }
      else {
        if ((http_set_cookie_warn_illegal == '\0') &&
           (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
          FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie name (in %s)\n         automatic %% encoding applied"
                         ,(ulong)(uint)(int)(char)bVar5,cookie.name);
        }
        local_78.data[lVar10] = '%';
        local_78.data[lVar10 + 1] = "0123456789ABCDEF"[*pbVar13 >> 4];
        local_78.data[lVar10 + 2] = "0123456789ABCDEF"[*pbVar13 & 0xf];
        lVar10 = lVar10 + 3;
      }
      if (capa <= lVar10 + 3U) {
        capa = capa + 0x20;
        fiobj_str_capa_assert(str,capa);
        if (str == 0) {
LAB_0014707f:
          local_98.data = anon_var_dwarf_20c;
          local_98.len._0_4_ = 4;
          goto LAB_00147092;
        }
        if ((str & 1) == 0) {
          switch((long)&switchD_0014700e::switchdataD_00169598 +
                 (long)(int)(&switchD_0014700e::switchdataD_00169598)[local_58]) {
          case 0x147010:
            cVar4 = *local_48;
LAB_00147017:
            pfVar9 = &FIOBJECT_VTABLE_NUMBER;
            switch(cVar4) {
            case '\'':
              pfVar9 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_0014700e_caseD_14705a;
            case ')':
              pfVar9 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_0014700e_caseD_147051;
            case '+':
              pfVar9 = &FIOBJECT_VTABLE_DATA;
            }
            break;
          case 0x147051:
switchD_0014700e_caseD_147051:
            pfVar9 = &FIOBJECT_VTABLE_HASH;
            break;
          case 0x14705a:
switchD_0014700e_caseD_14705a:
            pfVar9 = &FIOBJECT_VTABLE_STRING;
            break;
          case 0x14706c:
            if (cVar14 == '&') {
              local_98.data = anon_var_dwarf_217;
              local_98.len._0_4_ = 5;
            }
            else {
              if ((int)local_60 != 0x16) {
                cVar4 = cVar14;
                if ((int)local_60 == 6) goto LAB_0014707f;
                goto LAB_00147017;
              }
              local_98.data = anon_var_dwarf_222;
              local_98.len._0_4_ = 4;
            }
LAB_00147092:
            local_98.capa._0_4_ = 0;
            local_98.capa._4_4_ = 0;
            local_98.len._4_4_ = 0;
            goto LAB_00147096;
          }
          (*pfVar9->to_str)(&local_98,str);
        }
        else {
          fio_ltocstr(&local_98,local_50);
        }
LAB_00147096:
        local_78.data = local_98.data;
        local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
        local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
      }
      bVar5 = pbVar13[1];
      pbVar13 = pbVar13 + 1;
    } while (bVar5 != 0);
  }
  else {
    local_58 = (ulong)(uVar15 & 6);
    local_48 = (char *)(str & 0xfffffffffffffff8);
    local_60 = (char *)(CONCAT44(local_60._4_4_,uVar15) & 0xffffffff000000ff);
    sVar11 = 0;
    lVar10 = 0;
    local_50 = i;
    do {
      bVar5 = cookie.name[sVar11];
      if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [bVar5] == '\0') {
        local_78.data[lVar10] = bVar5;
        lVar10 = lVar10 + 1;
      }
      else {
        if ((http_set_cookie_warn_illegal == '\0') &&
           (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
          FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie name (in %s)\n         automatic %% encoding applied"
                         ,(ulong)(uint)(int)(char)bVar5,cookie.name);
        }
        local_78.data[lVar10] = '%';
        local_78.data[lVar10 + 1] = "0123456789ABCDEF"[(byte)cookie.name[sVar11] >> 4];
        local_78.data[lVar10 + 2] = "0123456789ABCDEF"[(byte)cookie.name[sVar11] & 0xf];
        lVar10 = lVar10 + 3;
      }
      if (capa <= lVar10 + 3U) {
        capa = capa + 0x20;
        fiobj_str_capa_assert(str,capa);
        if (str == 0) {
LAB_00146e89:
          local_98.data = anon_var_dwarf_20c;
          local_98.len._0_4_ = 4;
          goto LAB_00146e9c;
        }
        if ((str & 1) == 0) {
          switch((long)&switchD_00146e18::switchdataD_00169568 +
                 (long)(int)(&switchD_00146e18::switchdataD_00169568)[local_58]) {
          case 0x146e1a:
            cVar4 = *local_48;
LAB_00146e21:
            pfVar9 = &FIOBJECT_VTABLE_NUMBER;
            switch(cVar4) {
            case '\'':
              pfVar9 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_00146e18_caseD_146e64;
            case ')':
              pfVar9 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_00146e18_caseD_146e5b;
            case '+':
              pfVar9 = &FIOBJECT_VTABLE_DATA;
            }
            break;
          case 0x146e5b:
switchD_00146e18_caseD_146e5b:
            pfVar9 = &FIOBJECT_VTABLE_HASH;
            break;
          case 0x146e64:
switchD_00146e18_caseD_146e64:
            pfVar9 = &FIOBJECT_VTABLE_STRING;
            break;
          case 0x146e76:
            if (cVar14 == '&') {
              local_98.data = anon_var_dwarf_217;
              local_98.len._0_4_ = 5;
            }
            else {
              if ((int)local_60 != 0x16) {
                cVar4 = cVar14;
                if ((int)local_60 == 6) goto LAB_00146e89;
                goto LAB_00146e21;
              }
              local_98.data = anon_var_dwarf_222;
              local_98.len._0_4_ = 4;
            }
LAB_00146e9c:
            local_98.capa._0_4_ = 0;
            local_98.capa._4_4_ = 0;
            local_98.len._4_4_ = 0;
            goto LAB_00146ea0;
          }
          (*pfVar9->to_str)(&local_98,str);
        }
        else {
          fio_ltocstr(&local_98,local_50);
        }
LAB_00146ea0:
        local_78.data = local_98.data;
        local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
        local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
      }
      sVar11 = sVar11 + 1;
    } while (cookie.name_len != sVar11);
  }
  local_78.data[lVar10] = '=';
  lVar10 = lVar10 + 1;
  if (cookie.value == (char *)0x0) {
    cookie.max_age = -1;
  }
  else if (local_40 == 0) {
    bVar5 = *cookie.value;
    if (bVar5 != 0) {
      local_50 = (ulong)(uVar15 & 6);
      local_60 = (char *)(str & 0xfffffffffffffff8);
      local_58 = CONCAT44(local_58._4_4_,uVar15) & 0xffffffff000000ff;
      pbVar13 = (byte *)cookie.value;
      local_40 = i;
      do {
        if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [bVar5] == '\0') {
          local_78.data[lVar10] = bVar5;
          lVar10 = lVar10 + 1;
        }
        else {
          if ((http_set_cookie_warn_illegal == '\0') &&
             (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
            FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie value (in %s)\n         automatic %% encoding applied"
                           ,(ulong)(uint)(int)(char)bVar5,cookie.value);
          }
          local_78.data[lVar10] = '%';
          local_78.data[lVar10 + 1] = "0123456789ABCDEF"[*pbVar13 >> 4];
          local_78.data[lVar10 + 2] = "0123456789ABCDEF"[*pbVar13 & 0xf];
          lVar10 = lVar10 + 3;
        }
        if (capa <= lVar10 + 3U) {
          capa = capa + 0x20;
          fiobj_str_capa_assert(str,capa);
          if (str == 0) {
LAB_00147554:
            local_98.data = anon_var_dwarf_20c;
            local_98.len._0_4_ = 4;
            goto LAB_00147567;
          }
          if ((str & 1) == 0) {
            switch((long)&switchD_001474e3::switchdataD_001695f8 +
                   (long)(int)(&switchD_001474e3::switchdataD_001695f8)[local_50]) {
            case 0x1474e5:
              cVar4 = *local_60;
LAB_001474ec:
              pfVar9 = &FIOBJECT_VTABLE_NUMBER;
              switch(cVar4) {
              case '\'':
                pfVar9 = &FIOBJECT_VTABLE_FLOAT;
                break;
              case '(':
                goto switchD_001474e3_caseD_14752f;
              case ')':
                pfVar9 = &FIOBJECT_VTABLE_ARRAY;
                break;
              case '*':
                goto switchD_001474e3_caseD_147526;
              case '+':
                pfVar9 = &FIOBJECT_VTABLE_DATA;
              }
              break;
            case 0x147526:
switchD_001474e3_caseD_147526:
              pfVar9 = &FIOBJECT_VTABLE_HASH;
              break;
            case 0x14752f:
switchD_001474e3_caseD_14752f:
              pfVar9 = &FIOBJECT_VTABLE_STRING;
              break;
            case 0x147541:
              if (cVar14 == '&') {
                local_98.data = anon_var_dwarf_217;
                local_98.len._0_4_ = 5;
              }
              else {
                if ((int)local_58 != 0x16) {
                  cVar4 = cVar14;
                  if ((int)local_58 == 6) goto LAB_00147554;
                  goto LAB_001474ec;
                }
                local_98.data = anon_var_dwarf_222;
                local_98.len._0_4_ = 4;
              }
LAB_00147567:
              local_98.capa._0_4_ = 0;
              local_98.capa._4_4_ = 0;
              local_98.len._4_4_ = 0;
              goto LAB_0014756b;
            }
            (*pfVar9->to_str)(&local_98,str);
          }
          else {
            fio_ltocstr(&local_98,local_40);
          }
LAB_0014756b:
          local_78.data = local_98.data;
          local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
          local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
        }
        bVar5 = pbVar13[1];
        pbVar13 = pbVar13 + 1;
      } while (bVar5 != 0);
    }
  }
  else {
    local_58 = (ulong)(uVar15 & 6);
    local_48 = (char *)(str & 0xfffffffffffffff8);
    local_60 = (char *)(CONCAT44(local_60._4_4_,uVar15) & 0xffffffff000000ff);
    uVar12 = 0;
    local_50 = i;
    do {
      bVar5 = cookie.value[uVar12];
      if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [bVar5] == '\0') {
        local_78.data[lVar10] = bVar5;
        lVar10 = lVar10 + 1;
      }
      else {
        if ((http_set_cookie_warn_illegal == '\0') &&
           (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
          FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie value (in %s)\n         automatic %% encoding applied"
                         ,(ulong)(uint)(int)(char)bVar5,cookie.value);
        }
        local_78.data[lVar10] = '%';
        local_78.data[lVar10 + 1] = "0123456789ABCDEF"[(byte)cookie.value[uVar12] >> 4];
        local_78.data[lVar10 + 2] = "0123456789ABCDEF"[(byte)cookie.value[uVar12] & 0xf];
        lVar10 = lVar10 + 3;
      }
      if (capa <= lVar10 + 3U) {
        capa = capa + 0x20;
        fiobj_str_capa_assert(str,capa);
        if (str == 0) {
LAB_0014729d:
          local_98.data = anon_var_dwarf_20c;
          local_98.len._0_4_ = 4;
          goto LAB_001472b0;
        }
        if ((str & 1) == 0) {
          switch((long)&switchD_0014722c::switchdataD_001695c8 +
                 (long)(int)(&switchD_0014722c::switchdataD_001695c8)[local_58]) {
          case 0x14722e:
            cVar4 = *local_48;
LAB_00147235:
            pfVar9 = &FIOBJECT_VTABLE_NUMBER;
            switch(cVar4) {
            case '\'':
              pfVar9 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_0014722c_caseD_147278;
            case ')':
              pfVar9 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_0014722c_caseD_14726f;
            case '+':
              pfVar9 = &FIOBJECT_VTABLE_DATA;
            }
            break;
          case 0x14726f:
switchD_0014722c_caseD_14726f:
            pfVar9 = &FIOBJECT_VTABLE_HASH;
            break;
          case 0x147278:
switchD_0014722c_caseD_147278:
            pfVar9 = &FIOBJECT_VTABLE_STRING;
            break;
          case 0x14728a:
            if (cVar14 == '&') {
              local_98.data = anon_var_dwarf_217;
              local_98.len._0_4_ = 5;
            }
            else {
              if ((int)local_60 != 0x16) {
                cVar4 = cVar14;
                if ((int)local_60 == 6) goto LAB_0014729d;
                goto LAB_00147235;
              }
              local_98.data = anon_var_dwarf_222;
              local_98.len._0_4_ = 4;
            }
LAB_001472b0:
            local_98.capa._0_4_ = 0;
            local_98.capa._4_4_ = 0;
            local_98.len._4_4_ = 0;
            goto LAB_001472b4;
          }
          (*pfVar9->to_str)(&local_98,str);
        }
        else {
          fio_ltocstr(&local_98,local_50);
        }
LAB_001472b4:
        local_78.data = local_98.data;
        local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
        local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
      }
      uVar12 = uVar12 + 1;
    } while (local_40 != uVar12);
  }
  phVar3 = local_38;
  lVar1 = *(long *)((local_38->private_data).flag + 0x38);
  if ((lVar1 == 0) || (*(char *)(lVar1 + 0x7b) == '\0')) {
    local_78.data[lVar10] = ';';
    local_78.data[lVar10 + 1] = ' ';
    if ((local_38->status_str == 0) && (local_38->status != 0)) {
      if (capa <= lVar10 + 0x2aU) {
        fiobj_str_capa_assert(str,lVar10 + 0x2aU);
        fiobj_obj2cstr(&local_98,str);
        local_78.data = local_98.data;
        local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
        local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
      }
      if ((long)cookie.max_age == 0) {
        sVar11 = lVar10 + 2;
      }
      else {
        builtin_strncpy(local_78.data + lVar10 + 2,"Max-Age=",8);
        sVar8 = fio_ltoa(local_78.data + lVar10 + 10,(long)cookie.max_age,'\n');
        local_78.data[sVar8 + lVar10 + 10] = ';';
        sVar11 = lVar10 + sVar8 + 0xc;
        local_78.data[sVar8 + lVar10 + 0xb] = ' ';
      }
      fiobj_str_resize(str,sVar11);
      if (cookie.domain_len != 0 && cookie.domain != (char *)0x0) {
        fiobj_str_write(str,"domain=",7);
        fiobj_str_write(str,cookie.domain,cookie.domain_len);
        fiobj_str_write(str,";",1);
        local_78.data[sVar11] = ' ';
        sVar11 = sVar11 + 1;
      }
      if (cookie.path_len != 0 && cookie.path != (char *)0x0) {
        fiobj_str_write(str,"path=",5);
        fiobj_str_write(str,cookie.path,cookie.path_len);
        fiobj_str_write(str,";",1);
        local_78.data[sVar11] = ' ';
      }
      if (((undefined1  [72])hVar2 & (undefined1  [72])0x200000000) != (undefined1  [72])0x0) {
        fiobj_str_write(str,"HttpOnly;",9);
      }
      phVar3 = local_38;
      if (((undefined1  [72])hVar2 & (undefined1  [72])0x100000000) != (undefined1  [72])0x0) {
        fiobj_str_write(str,"secure;",7);
      }
      FVar6 = (phVar3->private_data).out_headers;
      pFVar7 = &HTTP_HEADER_SET_COOKIE;
      goto LAB_0014778b;
    }
    if (http_set_cookie::cookie_hash == 0) {
      http_set_cookie::cookie_hash = fio_siphash13("cookie",6,0x1456f2,0x145bc9);
    }
    FVar6 = fiobj_hash_get2((phVar3->private_data).out_headers,http_set_cookie::cookie_hash);
    if (FVar6 != 0) {
      fiobj_str_concat(FVar6,str);
      fiobj_free(str);
      return 0;
    }
  }
  else if (cookie.value == (char *)0x0) {
    fiobj_free(str);
    return -1;
  }
  FVar6 = (phVar3->private_data).out_headers;
  pFVar7 = &HTTP_HEADER_COOKIE;
LAB_0014778b:
  set_header_add(FVar6,*pFVar7,str);
  return 0;
}

Assistant:

int http_set_cookie(http_s *h, http_cookie_args_s cookie) {
#if DEBUG
  FIO_ASSERT(h, "Can't set cookie for NULL HTTP handler!");
#endif
  if (HTTP_INVALID_HANDLE(h) || cookie.name_len >= 32768 ||
      cookie.value_len >= 131072) {
    return -1;
  }

  static int warn_illegal = 0;

  /* write name and value while auto-correcting encoding issues */
  size_t capa = cookie.name_len + cookie.value_len + 128;
  size_t len = 0;
  FIOBJ c = fiobj_str_buf(capa);
  fio_str_info_s t = fiobj_obj2cstr(c);

#define copy_cookie_ch(ch_var)                                                 \
  if (invalid_cookie_##ch_var##_char[(uint8_t)cookie.ch_var[tmp]]) {           \
    if (!warn_illegal) {                                                       \
      ++warn_illegal;                                                          \
      FIO_LOG_WARNING("illegal char 0x%.2x in cookie " #ch_var " (in %s)\n"    \
                      "         automatic %% encoding applied",                \
                      cookie.ch_var[tmp], cookie.ch_var);                      \
    }                                                                          \
    t.data[len++] = '%';                                                       \
    t.data[len++] = hex_chars[((uint8_t)cookie.ch_var[tmp] >> 4) & 0x0F];      \
    t.data[len++] = hex_chars[(uint8_t)cookie.ch_var[tmp] & 0x0F];             \
  } else {                                                                     \
    t.data[len++] = cookie.ch_var[tmp];                                        \
  }                                                                            \
  tmp += 1;                                                                    \
  if (capa <= len + 3) {                                                       \
    capa += 32;                                                                \
    fiobj_str_capa_assert(c, capa);                                            \
    t = fiobj_obj2cstr(c);                                                     \
  }

  if (cookie.name) {
    size_t tmp = 0;
    if (cookie.name_len) {
      while (tmp < cookie.name_len) {
        copy_cookie_ch(name);
      }
    } else {
      while (cookie.name[tmp]) {
        copy_cookie_ch(name);
      }
    }
  }
  t.data[len++] = '=';
  if (cookie.value) {
    size_t tmp = 0;
    if (cookie.value_len) {
      while (tmp < cookie.value_len) {
        copy_cookie_ch(value);
      }
    } else {
      while (cookie.value[tmp]) {
        copy_cookie_ch(value);
      }
    }
  } else
    cookie.max_age = -1;

  if (http_settings(h) && http_settings(h)->is_client) {
    if (!cookie.value) {
      fiobj_free(c);
      return -1;
    }
    set_header_add(h->private_data.out_headers, HTTP_HEADER_COOKIE, c);
    return 0;
  }

  t.data[len++] = ';';
  t.data[len++] = ' ';

  if (h->status_str || !h->status) { /* on first request status == 0 */
    static uint64_t cookie_hash;
    if (!cookie_hash)
      cookie_hash = fiobj_hash_string("cookie", 6);
    FIOBJ tmp = fiobj_hash_get2(h->private_data.out_headers, cookie_hash);
    if (!tmp) {
      set_header_add(h->private_data.out_headers, HTTP_HEADER_COOKIE, c);
    } else {
      fiobj_str_join(tmp, c);
      fiobj_free(c);
    }
    return 0;
  }

  if (capa <= len + 40) {
    capa = len + 40;
    fiobj_str_capa_assert(c, capa);
    t = fiobj_obj2cstr(c);
  }
  if (cookie.max_age) {
    memcpy(t.data + len, "Max-Age=", 8);
    len += 8;
    len += fio_ltoa(t.data + len, cookie.max_age, 10);
    t.data[len++] = ';';
    t.data[len++] = ' ';
  }
  fiobj_str_resize(c, len);

  if (cookie.domain && cookie.domain_len) {
    fiobj_str_write(c, "domain=", 7);
    fiobj_str_write(c, cookie.domain, cookie.domain_len);
    fiobj_str_write(c, ";", 1);
    t.data[len++] = ' ';
  }
  if (cookie.path && cookie.path_len) {
    fiobj_str_write(c, "path=", 5);
    fiobj_str_write(c, cookie.path, cookie.path_len);
    fiobj_str_write(c, ";", 1);
    t.data[len++] = ' ';
  }
  if (cookie.http_only) {
    fiobj_str_write(c, "HttpOnly;", 9);
  }
  if (cookie.secure) {
    fiobj_str_write(c, "secure;", 7);
  }
  set_header_add(h->private_data.out_headers, HTTP_HEADER_SET_COOKIE, c);
  return 0;
}